

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

Rule * slang::ast::RandSeqProductionSymbol::createRule
                 (RsRuleSyntax *syntax,ASTContext *context,StatementBlockSymbol *ruleBlock)

{
  undefined8 uVar1;
  SourceRange sourceRange;
  span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL> prods_00;
  optional<slang::ast::RandSeqProductionSymbol::CodeBlockProd> codeBlock_00;
  sockaddr *__addr;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  reference ppRVar5;
  Rule *pRVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __extent_storage<18446744073709551615UL> this;
  StatementBlockSymbol *ruleBlock_00;
  Expression *in_RCX;
  sockaddr *in_RDX;
  EVP_PKEY_CTX *src;
  Expression *extraout_RDX;
  long in_RSI;
  Rule *in_RDI;
  StatementContext stmtCtx;
  StatementBlockSymbol *block;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> __end2_1;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> __begin2_1;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
  *__range2_1;
  Expression *randJoinExpr;
  bool isRandJoin;
  RsWeightClauseSyntax *wc;
  optional<slang::ast::RandSeqProductionSymbol::CodeBlockProd> codeBlock;
  Expression *weightExpr;
  ProdItem item;
  Expression *expr_1;
  RsRepeatSyntax *rrs;
  optional<slang::ast::RandSeqProductionSymbol::ProdItem> elseItem;
  ProdItem ifItem;
  Expression *expr;
  RsIfElseSyntax *ries;
  RsProdSyntax *p;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::RsProdSyntax> *__range2;
  SmallVector<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_5UL> prods;
  Compilation *comp;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> blockIt;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
  blockRange;
  ASTContext *in_stack_fffffffffffffbb8;
  Type *in_stack_fffffffffffffbc0;
  StatementBlockSymbol *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  ASTContext *in_stack_fffffffffffffbd8;
  SourceLocation in_stack_fffffffffffffbe0;
  Expression *weightExpr_00;
  SourceLocation in_stack_fffffffffffffbe8;
  StatementBlockSymbol *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  Type *in_stack_fffffffffffffc08;
  Diagnostic *in_stack_fffffffffffffc10;
  Diagnostic *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  StatementContext *in_stack_fffffffffffffc68;
  ASTContext *in_stack_fffffffffffffc70;
  StatementBlockSymbol *in_stack_fffffffffffffc78;
  bitmask<slang::ast::StatementFlags> local_27c [5];
  underlying_type local_268;
  StatementBlockSymbol *local_248;
  Symbol *local_240;
  Symbol *local_238;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
  *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined4 local_214;
  bitmask<slang::ast::ASTFlags> local_210;
  long local_208;
  undefined1 local_1f9;
  Symbol *local_1f8;
  bitmask<slang::ast::ASTFlags> local_1e0;
  long local_1d8;
  StatementContext *local_1b8;
  RsProdSyntax *local_98;
  RsProdSyntax **local_90;
  __normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
  local_88;
  long local_80;
  SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*> local_78 [2];
  Compilation *local_38;
  Symbol *local_30;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
  local_28;
  Expression *local_18;
  sockaddr *local_10;
  long local_8;
  undefined4 extraout_var_01;
  
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  local_28 = Scope::membersOfType<slang::ast::StatementBlockSymbol>
                       ((Scope *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
  local_30 = (Symbol *)
             std::ranges::
             subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
             ::begin(&local_28);
  local_38 = ASTContext::getCompilation((ASTContext *)0x6414f2);
  SmallVector<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_5UL> *)0x641507);
  local_80 = local_8 + 0x20;
  local_88._M_current =
       (RsProdSyntax **)
       std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL> *)
                  in_stack_fffffffffffffbb8);
  local_90 = (RsProdSyntax **)
             std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>::end
                       ((span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL> *)
                        in_stack_fffffffffffffbc8);
  bVar2 = __gnu_cxx::
          operator==<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
                    ((__normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
                      *)in_stack_fffffffffffffbc0,
                     (__normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
                      *)in_stack_fffffffffffffbb8);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    ppRVar5 = __gnu_cxx::
              __normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_88);
    local_98 = *ppRVar5;
    pRVar6 = (Rule *)(*(code *)(&DAT_00c8e3fc +
                               *(int *)(&DAT_00c8e3fc +
                                       (ulong)((local_98->super_SyntaxNode).kind - RsCase) * 4)))();
    return pRVar6;
  }
  local_1b8 = (StatementContext *)0x0;
  std::optional<slang::ast::RandSeqProductionSymbol::CodeBlockProd>::optional
            ((optional<slang::ast::RandSeqProductionSymbol::CodeBlockProd> *)0x641aa0);
  local_1d8 = *(long *)(local_8 + 0x58);
  if (local_1d8 != 0) {
    in_stack_fffffffffffffc70 =
         (ASTContext *)
         not_null<slang::syntax::ExpressionSyntax_*>::operator*
                   ((not_null<slang::syntax::ExpressionSyntax_*> *)0x641ad4);
    __addr = local_10;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_1e0,None);
    iVar4 = Expression::bind((int)in_stack_fffffffffffffc70,__addr,(socklen_t)local_1e0.m_bits);
    in_stack_fffffffffffffc68 = (StatementContext *)CONCAT44(extraout_var,iVar4);
    local_1b8 = in_stack_fffffffffffffc68;
    ASTContext::requireIntegral
              ((ASTContext *)in_stack_fffffffffffffbe8,(Expression *)in_stack_fffffffffffffbe0);
    if (*(long *)(local_1d8 + 0x30) != 0) {
      local_1f8 = (Symbol *)
                  iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_false>
                  ::
                  operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
                            ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_false>
                              *)in_stack_fffffffffffffbc8,
                             (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_false>
      ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_false>
                   *)0x641b98);
      CodeBlockProd::CodeBlockProd
                ((CodeBlockProd *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 in_stack_fffffffffffffbc8);
      std::optional<slang::ast::RandSeqProductionSymbol::CodeBlockProd>::operator=
                ((optional<slang::ast::RandSeqProductionSymbol::CodeBlockProd> *)
                 CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (CodeBlockProd *)in_stack_fffffffffffffbc8);
    }
  }
  local_1f9 = 0;
  local_208 = 0;
  if ((*(long *)(local_8 + 0x18) != 0) &&
     (local_1f9 = 1, *(long *)(*(long *)(local_8 + 0x18) + 0x38) != 0)) {
    uVar1 = *(undefined8 *)(*(long *)(local_8 + 0x18) + 0x38);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_210,None);
    iVar4 = Expression::bind((int)uVar1,local_10,(socklen_t)local_210.m_bits);
    local_208 = CONCAT44(extraout_var_00,iVar4);
    bVar2 = Expression::bad((Expression *)in_stack_fffffffffffffbc0);
    if (!bVar2) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x641cb8)
      ;
      in_stack_fffffffffffffc27 = Type::isNumeric(in_stack_fffffffffffffbc0);
      if (!(bool)in_stack_fffffffffffffc27) {
        local_214 = 0xb40006;
        local_228 = *(undefined8 *)(local_208 + 0x20);
        uStack_220 = *(undefined8 *)(local_208 + 0x28);
        sourceRange.endLoc = in_stack_fffffffffffffbe8;
        sourceRange.startLoc = in_stack_fffffffffffffbe0;
        in_stack_fffffffffffffc18 =
             ASTContext::addDiag(in_stack_fffffffffffffbd8,
                                 SUB84((ulong)in_stack_fffffffffffffbf0 >> 0x20,0),sourceRange);
        in_stack_fffffffffffffc10 =
             (Diagnostic *)
             not_null<const_slang::ast::Type_*>::operator*
                       ((not_null<const_slang::ast::Type_*> *)0x641d34);
        ast::operator<<(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      }
    }
  }
  local_230 = &local_28;
  local_238 = (Symbol *)
              std::ranges::
              subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
              ::begin(local_230);
  this._M_extent_value =
       (size_t)std::ranges::
               subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
               ::end(local_230);
  local_240 = (Symbol *)this._M_extent_value;
  while (uVar3 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
                           ((self_type *)in_stack_fffffffffffffbc0,
                            (specific_symbol_iterator<slang::ast::StatementBlockSymbol> *)
                            in_stack_fffffffffffffbb8), ((uVar3 ^ 0xff) & 1) != 0) {
    in_stack_fffffffffffffbf0 =
         iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_false>
         ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_false>
                      *)0x641ddb);
    local_248 = in_stack_fffffffffffffbf0;
    Statement::StatementContext::StatementContext
              ((StatementContext *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    bitmask<slang::ast::StatementFlags>::bitmask(local_27c,InRandSeq);
    local_268 = local_27c[0].m_bits;
    StatementBlockSymbol::getStatement
              (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    Statement::StatementContext::~StatementContext((StatementContext *)this._M_extent_value);
    iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_false>
    ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
              ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_false>
                *)in_stack_fffffffffffffbc0);
  }
  iVar4 = SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>::copy
                    (local_78,(EVP_PKEY_CTX *)local_38,src);
  ruleBlock_00 = (StatementBlockSymbol *)CONCAT44(extraout_var_01,iVar4);
  weightExpr_00 = extraout_RDX;
  std::span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>::
  span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_18446744073709551615UL>
            ((span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>
              *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_18446744073709551615UL> *)
             in_stack_fffffffffffffbc8);
  prods_00._M_ptr._7_1_ = uVar3;
  prods_00._M_ptr._0_7_ = in_stack_fffffffffffffbf8;
  prods_00._M_extent._M_extent_value = this._M_extent_value;
  codeBlock_00.super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
  _M_payload._M_value.block.ptr =
       (not_null<const_slang::ast::StatementBlockSymbol_*>)
       (not_null<const_slang::ast::StatementBlockSymbol_*>)in_stack_fffffffffffffc18;
  codeBlock_00.super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
  _M_payload._0_8_ = in_stack_fffffffffffffc10;
  codeBlock_00.super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>._16_7_
       = in_stack_fffffffffffffc20;
  codeBlock_00.super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>._23_1_
       = in_stack_fffffffffffffc27;
  Rule::Rule((Rule *)in_stack_fffffffffffffbf0,ruleBlock_00,prods_00,weightExpr_00,local_18,
             codeBlock_00,SUB41((uint)in_stack_fffffffffffffbd4 >> 0x18,0));
  SmallVector<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_5UL> *)0x641f75);
  return in_RDI;
}

Assistant:

RandSeqProductionSymbol::Rule RandSeqProductionSymbol::createRule(
    const RsRuleSyntax& syntax, const ASTContext& context, const StatementBlockSymbol& ruleBlock) {

    auto blockRange = ruleBlock.membersOfType<StatementBlockSymbol>();
    auto blockIt = blockRange.begin();

    auto& comp = context.getCompilation();
    SmallVector<const ProdBase*> prods;
    for (auto p : syntax.prods) {
        switch (p->kind) {
            case SyntaxKind::RsProdItem:
                prods.push_back(
                    comp.emplace<ProdItem>(createProdItem(p->as<RsProdItemSyntax>(), context)));
                break;
            case SyntaxKind::RsCodeBlock: {
                SLANG_ASSERT(blockIt != blockRange.end());
                prods.push_back(comp.emplace<CodeBlockProd>(*blockIt++));
                break;
            }
            case SyntaxKind::RsIfElse: {
                auto& ries = p->as<RsIfElseSyntax>();
                auto& expr = Expression::bind(*ries.condition, context);
                auto ifItem = createProdItem(*ries.ifItem, context);

                std::optional<ProdItem> elseItem;
                if (ries.elseClause)
                    elseItem = createProdItem(*ries.elseClause->item, context);

                if (!expr.bad())
                    context.requireBooleanConvertible(expr);

                prods.push_back(comp.emplace<IfElseProd>(expr, ifItem, elseItem));
                break;
            }
            case SyntaxKind::RsRepeat: {
                auto& rrs = p->as<RsRepeatSyntax>();
                auto& expr = Expression::bind(*rrs.expr, context);
                auto item = createProdItem(*rrs.item, context);
                prods.push_back(comp.emplace<RepeatProd>(expr, item));

                context.requireIntegral(expr);
                break;
            }
            case SyntaxKind::RsCase:
                prods.push_back(&createCaseProd(p->as<RsCaseSyntax>(), context));
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    const Expression* weightExpr = nullptr;
    std::optional<CodeBlockProd> codeBlock;
    if (auto wc = syntax.weightClause) {
        weightExpr = &Expression::bind(*wc->weight, context);
        context.requireIntegral(*weightExpr);

        if (wc->codeBlock) {
            SLANG_ASSERT(blockIt != blockRange.end());
            codeBlock = CodeBlockProd(*blockIt++);
        }
    }

    bool isRandJoin = false;
    const Expression* randJoinExpr = nullptr;
    if (syntax.randJoin) {
        isRandJoin = true;
        if (syntax.randJoin->expr) {
            randJoinExpr = &Expression::bind(*syntax.randJoin->expr, context);

            if (!randJoinExpr->bad() && !randJoinExpr->type->isNumeric()) {
                context.addDiag(diag::RandJoinNotNumeric, randJoinExpr->sourceRange)
                    << *randJoinExpr->type;
            }
        }
    }

    for (auto& block : blockRange) {
        Statement::StatementContext stmtCtx(context);
        stmtCtx.flags = StatementFlags::InRandSeq;
        block.getStatement(context, stmtCtx);
    }

    return {ruleBlock, prods.copy(comp), weightExpr, randJoinExpr, codeBlock, isRandJoin};
}